

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O0

void __thiscall
wabt::OpcodeInfo::OpcodeInfo<unsigned_int>
          (OpcodeInfo *this,Opcode opcode,Kind kind,uint *data,size_t count,uint extra)

{
  size_type_conflict sVar1;
  uchar *puVar2;
  uint extra_local;
  size_t count_local;
  uint *data_local;
  Kind kind_local;
  OpcodeInfo *this_local;
  Opcode opcode_local;
  
  OpcodeInfo<unsigned_int>(this,opcode,kind,data,count);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,sVar1 + 4);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data_);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
  *(uint *)(puVar2 + (sVar1 - 4)) = extra;
  return;
}

Assistant:

OpcodeInfo::OpcodeInfo(Opcode opcode, Kind kind, T* data, size_t count, T extra)
    : OpcodeInfo(opcode, kind, data, count) {
  data_.resize(data_.size() + sizeof(T));
  memcpy(data_.data() + data_.size() - sizeof(T), &extra, sizeof(T));
}